

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.cpp
# Opt level: O0

void AudioBackend_PlaySound(AudioBackend_Sound *sound,BOOL looping)

{
  uchar uVar1;
  BOOL looping_local;
  AudioBackend_Sound *sound_local;
  
  if (sound != (AudioBackend_Sound *)0x0) {
    ma_mutex_lock(&mutex);
    sound->playing = true;
    sound->looping = looping;
    if (looping) {
      uVar1 = *sound->samples;
    }
    else {
      uVar1 = 0x80;
    }
    sound->samples[sound->frames] = uVar1;
    ma_mutex_unlock(&mutex);
  }
  return;
}

Assistant:

void AudioBackend_PlaySound(AudioBackend_Sound *sound, BOOL looping)
{
	if (sound == NULL)
		return;

	ma_mutex_lock(&mutex);

	sound->playing = TRUE;
	sound->looping = looping;

	sound->samples[sound->frames] = looping ? sound->samples[0] : 0x80;	// For the linear interpolator

	ma_mutex_unlock(&mutex);
}